

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

report * __thiscall
picobench::runner::generate_report<std::equal_to<long>>(report *__return_storage_ptr__,runner *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *this_00;
  pointer psVar5;
  bool *pbVar6;
  reference this_01;
  pointer pbVar7;
  pointer pbVar8;
  uint *puVar9;
  reference this_02;
  int64_t iVar10;
  result_t rVar11;
  result_t *__x;
  char *pcVar12;
  ostream *poVar13;
  reference pvVar14;
  reference ppVar15;
  byte local_241;
  vector<int,_std::allocator<int>_> *local_200;
  value_type *f;
  problem_space_benchmark *b_2;
  iterator __end5_1;
  iterator __begin5_1;
  vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
  *__range5_1;
  result_t result0;
  value_type *b_1;
  pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>
  *space;
  iterator __end4_2;
  iterator __begin4_2;
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  *__range4_2;
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  psview;
  suite *suite_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<picobench::report::suite,_std::allocator<picobench::report::suite>_> *__range3_1;
  reference local_108;
  benchmark_problem_space *d_1;
  iterator __end5;
  iterator __begin5;
  vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
  *__range5;
  state *state;
  iterator __end4_1;
  iterator __begin4_1;
  vector<picobench::state,_std::allocator<picobench::state>_> *__range4_1;
  int64_t iStack_c0;
  result_t local_b8;
  uint local_ac;
  const_iterator cStack_a8;
  int d;
  const_iterator __end4;
  const_iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> *state_iterations;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  const_iterator __end3;
  const_iterator __begin3;
  benchmarks_vector *__range3;
  iterator rpt_benchmark;
  rsuite *suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *__range2;
  iterator rpt_suite;
  runner *this_local;
  report *local_10;
  report *rpt;
  
  local_10 = __return_storage_ptr__;
  report::report(__return_storage_ptr__);
  sVar4 = std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::size
                    (&(this->super_registry)._suites);
  std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::resize
            (&__return_storage_ptr__->suites,sVar4);
  __range2 = (vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *)
             std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::begin
                       (&__return_storage_ptr__->suites);
  this_00 = &(this->super_registry)._suites;
  __end2 = std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::begin(this_00);
  suite = (rsuite *)std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::end(this_00)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
                                     *)&suite), bVar2) {
    rpt_benchmark._M_current =
         (benchmark *)
         __gnu_cxx::
         __normal_iterator<const_picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
         ::operator*(&__end2);
    pcVar12 = (rpt_benchmark._M_current)->name;
    psVar5 = __gnu_cxx::
             __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
             ::operator->((__normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                           *)&__range2);
    psVar5->name = pcVar12;
    psVar5 = __gnu_cxx::
             __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
             ::operator->((__normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                           *)&__range2);
    sVar4 = std::
            vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
            ::size((vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                    *)&(rpt_benchmark._M_current)->is_baseline);
    std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>::resize
              (&psVar5->benchmarks,sVar4);
    psVar5 = __gnu_cxx::
             __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
             ::operator->((__normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                           *)&__range2);
    __range3 = (benchmarks_vector *)
               std::
               vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>::
               begin(&psVar5->benchmarks);
    pbVar6 = &(rpt_benchmark._M_current)->is_baseline;
    __end3 = std::
             vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
             ::begin((vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                      *)pbVar6);
    b = (unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *)
        std::
        vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
        ::end((vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
               *)pbVar6);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                                       *)&b), bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                ::operator*(&__end3);
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      pcVar12 = (pbVar7->super_benchmark)._name;
      pbVar8 = __gnu_cxx::
               __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
               ::operator->((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                             *)&__range3);
      pbVar8->name = pcVar12;
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      bVar2 = (pbVar7->super_benchmark)._baseline;
      pbVar8 = __gnu_cxx::
               __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
               ::operator->((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                             *)&__range3);
      pbVar8->is_baseline = (bool)(bVar2 & 1);
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        (&(pbVar7->super_benchmark)._state_iterations);
      if (bVar2) {
        local_200 = &this->_default_state_iterations;
      }
      else {
        pbVar7 = std::
                 unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                 ::operator->(this_01);
        local_200 = &(pbVar7->super_benchmark)._state_iterations;
      }
      pbVar8 = __gnu_cxx::
               __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
               ::operator->((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                             *)&__range3);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(local_200);
      std::
      vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
      ::reserve(&pbVar8->data,sVar4);
      __end4 = std::vector<int,_std::allocator<int>_>::begin(local_200);
      cStack_a8 = std::vector<int,_std::allocator<int>_>::end(local_200);
      while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff58), bVar2) {
        puVar9 = (uint *)__gnu_cxx::
                         __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end4);
        local_ac = *puVar9;
        pbVar8 = __gnu_cxx::
                 __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                 ::operator->((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                               *)&__range3);
        iStack_c0 = 0;
        local_b8 = 0;
        __range4_1 = (vector<picobench::state,_std::allocator<picobench::state>_> *)(ulong)local_ac;
        std::
        vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
        ::push_back(&pbVar8->data,(value_type *)&__range4_1);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end4);
      }
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      __end4_1 = std::vector<picobench::state,_std::allocator<picobench::state>_>::begin
                           (&pbVar7->_states);
      state = (state *)std::vector<picobench::state,_std::allocator<picobench::state>_>::end
                                 (&pbVar7->_states);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
                                 *)&state), bVar2) {
        this_02 = __gnu_cxx::
                  __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
                  ::operator*(&__end4_1);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                 ::operator->((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                               *)&__range3);
        __end5 = std::
                 vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                 ::begin(&pbVar8->data);
        d_1 = (benchmark_problem_space *)
              std::
              vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
              ::end(&pbVar8->data);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
                                           *)&d_1), bVar2) {
          local_108 = __gnu_cxx::
                      __normal_iterator<picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
                      ::operator*(&__end5);
          iVar3 = picobench::state::iterations(this_02);
          if (iVar3 == local_108->dimension) {
            if ((local_108->total_time_ns == 0) ||
               (lVar1 = local_108->total_time_ns, iVar10 = picobench::state::duration_ns(this_02),
               iVar10 < lVar1)) {
              iVar10 = picobench::state::duration_ns(this_02);
              local_108->total_time_ns = iVar10;
              rVar11 = picobench::state::result(this_02);
              local_108->result = rVar11;
            }
            if ((this->_compare_results_across_samples & 1U) != 0) {
              lVar1 = local_108->result;
              rVar11 = picobench::state::result(this_02);
              local_241 = 0;
              if (lVar1 != rVar11) {
                __x = &local_108->result;
                __range3_1 = (vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>
                              *)picobench::state::result(this_02);
                bVar2 = std::equal_to<long>::operator()
                                  ((equal_to<long> *)((long)&this_local + 7),__x,(long *)&__range3_1
                                  );
                local_241 = bVar2 ^ 0xff;
              }
              if ((local_241 & 1) != 0) {
                poVar13 = std::operator<<(this->_stderr,"Error: Two samples of ");
                pbVar7 = std::
                         unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                         ::operator->(this_01);
                pcVar12 = benchmark::name(&pbVar7->super_benchmark);
                poVar13 = std::operator<<(poVar13,pcVar12);
                poVar13 = std::operator<<(poVar13," @");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_108->dimension);
                poVar13 = std::operator<<(poVar13," produced different results: ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_108->result);
                poVar13 = std::operator<<(poVar13," and ");
                rVar11 = picobench::state::result(this_02);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,rVar11);
                std::operator<<(poVar13,'\n');
                this->_error = error_sample_compare;
              }
            }
            local_108->samples = local_108->samples + 1;
          }
          __gnu_cxx::
          __normal_iterator<picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
          ::operator++(&__end5);
        }
        __gnu_cxx::
        __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
        ::operator++(&__end4_1);
      }
      __gnu_cxx::
      __normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
      ::operator++((__normal_iterator<picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                    *)&__range3);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
    ::operator++((__normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
    ::operator++(&__end2);
  }
  if ((this->_compare_results_across_benchmarks & 1U) != 0) {
    __end3_1 = std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::
               begin(&__return_storage_ptr__->suites);
    suite_1 = (suite *)std::
                       vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::
                       end(&__return_storage_ptr__->suites);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                               *)&suite_1), bVar2) {
      psview._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)__gnu_cxx::
                   __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
                   ::operator*(&__end3_1);
      report::get_problem_space_view
                ((map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                  *)&__range4_2,(suite *)psview._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __end4_2 = std::
                 map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                 ::begin((map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                          *)&__range4_2);
      space = (pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>
               *)std::
                 map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                 ::end((map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                        *)&__range4_2);
      while (bVar2 = std::operator!=(&__end4_2,(_Self *)&space), bVar2) {
        b_1 = (value_type *)
              std::
              _Rb_tree_iterator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>
              ::operator*(&__end4_2);
        sVar4 = std::
                vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                ::size((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                        *)&b_1->is_baseline);
        if (sVar4 == 1) {
          result0 = (result_t)
                    std::
                    vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                    ::front((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                             *)&b_1->is_baseline);
          poVar13 = std::operator<<(this->_stdwarn,"Warning: Benchmark ");
          poVar13 = std::operator<<(poVar13,*(char **)result0);
          poVar13 = std::operator<<(poVar13," @");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)&b_1->name);
          std::operator<<(poVar13," has a single instance and cannot be compared to others.\n");
        }
        else {
          pvVar14 = std::
                    vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                    ::front((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                             *)&b_1->is_baseline);
          __range5_1 = (vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                        *)pvVar14->result;
          pbVar6 = &b_1->is_baseline;
          __end5_1 = std::
                     vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                     ::begin((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                              *)pbVar6);
          b_2 = (problem_space_benchmark *)
                std::
                vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                ::end((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                       *)pbVar6);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<picobench::report::problem_space_benchmark_*,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>
                                     *)&b_2), bVar2) {
            ppVar15 = __gnu_cxx::
                      __normal_iterator<picobench::report::problem_space_benchmark_*,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>
                      ::operator*(&__end5_1);
            if ((__range5_1 !=
                 (vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                  *)ppVar15->result) &&
               (bVar2 = std::equal_to<long>::operator()
                                  ((equal_to<long> *)((long)&this_local + 7),(long *)&__range5_1,
                                   &ppVar15->result), !bVar2)) {
              pvVar14 = std::
                        vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                        ::front((vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                                 *)&b_1->is_baseline);
              poVar13 = std::operator<<(this->_stderr,"Error: Benchmarks ");
              poVar13 = std::operator<<(poVar13,pvVar14->name);
              poVar13 = std::operator<<(poVar13," and ");
              poVar13 = std::operator<<(poVar13,ppVar15->name);
              poVar13 = std::operator<<(poVar13," @");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)&b_1->name);
              poVar13 = std::operator<<(poVar13," produce different results: ");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,(long)__range5_1);
              poVar13 = std::operator<<(poVar13," and ");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,ppVar15->result);
              std::operator<<(poVar13,'\n');
              this->_error = error_benchmark_compare;
            }
            __gnu_cxx::
            __normal_iterator<picobench::report::problem_space_benchmark_*,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>
            ::operator++(&__end5_1);
          }
        }
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>
        ::operator++(&__end4_2);
      }
      std::
      map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
      ::~map((map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
              *)&__range4_2);
      __gnu_cxx::
      __normal_iterator<picobench::report::suite_*,_std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>_>
      ::operator++(&__end3_1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

report generate_report(CompareResult cmp = std::equal_to<result_t>()) const
    {
        report rpt;

        rpt.suites.resize(_suites.size());
        auto rpt_suite = rpt.suites.begin();

        for (auto& suite : _suites)
        {
            rpt_suite->name = suite.name;

            // build benchmark view
            rpt_suite->benchmarks.resize(suite.benchmarks.size());
            auto rpt_benchmark = rpt_suite->benchmarks.begin();

            for (auto& b : suite.benchmarks)
            {
                rpt_benchmark->name = b->_name;
                rpt_benchmark->is_baseline = b->_baseline;

                const std::vector<int>& state_iterations =
                    b->_state_iterations.empty() ?
                    _default_state_iterations :
                    b->_state_iterations;

                rpt_benchmark->data.reserve(state_iterations.size());
                for (auto d : state_iterations)
                {
                    rpt_benchmark->data.push_back({ d, 0, 0ll });
                }

                for (auto& state : b->_states)
                {
                    for (auto& d : rpt_benchmark->data)
                    {
                        if (state.iterations() == d.dimension)
                        {
                            if (d.total_time_ns == 0 || d.total_time_ns > state.duration_ns())
                            {
                                d.total_time_ns = state.duration_ns();
                                d.result = state.result();
                            }

                            if (_compare_results_across_samples)
                            {
                                if (d.result != state.result() && !cmp(d.result, state.result()))
                                {
                                    *_stderr << "Error: Two samples of " << b->name() << " @" << d.dimension << " produced different results: "
                                             << d.result << " and " << state.result() << '\n';
                                    _error = error_sample_compare;
                                }
                            }

                            ++d.samples;
                        }
                    }
                }

#if defined(PICOBENCH_DEBUG)
                for (auto& d : rpt_benchmark->data)
                {
                    I_PICOBENCH_ASSERT(d.samples == b->_samples);
                }
#endif

                ++rpt_benchmark;
            }

            ++rpt_suite;
        }

        if (_compare_results_across_benchmarks)
        {
            for(auto& suite : rpt.suites)
            {
                auto psview = report::get_problem_space_view(suite);

                for (auto& space : psview)
                {
                    I_PICOBENCH_ASSERT(!space.second.empty());

                    if (space.second.size() == 1)
                    {
                        auto& b = space.second.front();
                        *_stdwarn << "Warning: Benchmark " << b.name << " @" << space.first
                                  << " has a single instance and cannot be compared to others.\n";
                        continue;
                    }

                    auto result0 = space.second.front().result;

                    for (auto& b : space.second)
                    {
                        if (result0 != b.result && !cmp(result0, b.result))
                        {
                            auto& f = space.second.front();
                            *_stderr << "Error: Benchmarks " << f.name << " and " << b.name
                                     << " @" << space.first << " produce different results: "
                                     << result0 << " and " << b.result << '\n';
                            _error = error_benchmark_compare;
                        }
                    }
                }
            }
        }

        return rpt;
    }